

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

Json json11::Json::parse(string *in,string *err,JsonParse strategy)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  long lVar1;
  char *pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Json JVar3;
  json11 local_a8 [32];
  string local_88 [32];
  undefined4 local_68;
  undefined1 local_58 [8];
  Json result;
  JsonParser parser;
  JsonParse strategy_local;
  string *err_local;
  string *in_local;
  
  this = &result.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  result.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)err;
  anon_unknown_21::JsonParser::parse_json((JsonParser *)local_58,(int)this);
  anon_unknown_21::JsonParser::consume_garbage((JsonParser *)this);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    Json((Json *)in,(Json *)local_58);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)err);
    esc_abi_cxx11_(local_a8,*pcVar2);
    std::operator+((char *)local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "unexpected trailing ");
    anon_unknown_21::JsonParser::fail
              ((JsonParser *)in,
               (string *)
               &result.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)local_a8);
  }
  local_68 = 1;
  ~Json((Json *)local_58);
  JVar3.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar3.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in;
  return (Json)JVar3.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json Json::parse(const string &in, string &err, JsonParse strategy) {
    JsonParser parser { in, 0, err, false, strategy };
    Json result = parser.parse_json(0);

    // Check for any trailing garbage
    parser.consume_garbage();
    if (parser.failed)
        return Json();
    if (parser.i != in.size())
        return parser.fail("unexpected trailing " + esc(in[parser.i]));

    return result;
}